

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

void __thiscall
icu_63::OlsonTimeZone::getTimeZoneRules
          (OlsonTimeZone *this,InitialTimeZoneRule **initial,TimeZoneRule **trsrules,
          int32_t *trscount,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode UVar2;
  int local_44;
  undefined1 local_40 [4];
  int32_t tmpcnt;
  InitialTimeZoneRule *tmpini;
  int32_t i;
  int32_t cnt;
  UErrorCode *status_local;
  int32_t *trscount_local;
  TimeZoneRule **trsrules_local;
  InitialTimeZoneRule **initial_local;
  OlsonTimeZone *this_local;
  
  _i = status;
  status_local = trscount;
  trscount_local = (int32_t *)trsrules;
  trsrules_local = (TimeZoneRule **)initial;
  initial_local = (InitialTimeZoneRule **)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    checkTransitionRules(this,_i);
    UVar1 = ::U_FAILURE(*_i);
    if (UVar1 == '\0') {
      *trsrules_local = &this->initialRule->super_TimeZoneRule;
      tmpini._4_4_ = U_ZERO_ERROR;
      if ((this->historicRules != (TimeArrayTimeZoneRule **)0x0) && (U_ZERO_ERROR < *status_local))
      {
        for (tmpini._0_4_ = 0; (int)tmpini < this->historicRuleCount; tmpini._0_4_ = (int)tmpini + 1
            ) {
          if (this->historicRules[(int)tmpini] != (TimeArrayTimeZoneRule *)0x0) {
            UVar2 = tmpini._4_4_ + U_ILLEGAL_ARGUMENT_ERROR;
            *(TimeArrayTimeZoneRule **)(trscount_local + (long)tmpini._4_4_ * 2) =
                 this->historicRules[(int)tmpini];
            tmpini._4_4_ = UVar2;
            if (*status_local <= UVar2) break;
          }
        }
      }
      if ((this->finalZoneWithStartYear != (SimpleTimeZone *)0x0) && (tmpini._4_4_ < *status_local))
      {
        local_44 = *status_local - tmpini._4_4_;
        (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject.
          _vptr_UObject[0x12])
                  (this->finalZoneWithStartYear,local_40,trscount_local + (long)tmpini._4_4_ * 2,
                   &local_44,_i);
        UVar1 = ::U_FAILURE(*_i);
        if (UVar1 != '\0') {
          return;
        }
        tmpini._4_4_ = local_44 + tmpini._4_4_;
      }
      *status_local = tmpini._4_4_;
    }
  }
  return;
}

Assistant:

void
OlsonTimeZone::getTimeZoneRules(const InitialTimeZoneRule*& initial,
                                const TimeZoneRule* trsrules[],
                                int32_t& trscount,
                                UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return;
    }

    // Initial rule
    initial = initialRule;

    // Transition rules
    int32_t cnt = 0;
    if (historicRules != NULL && trscount > cnt) {
        // historicRules may contain null entries when original zoneinfo data
        // includes non transition data.
        for (int32_t i = 0; i < historicRuleCount; i++) {
            if (historicRules[i] != NULL) {
                trsrules[cnt++] = historicRules[i];
                if (cnt >= trscount) {
                    break;
                }
            }
        }
    }
    if (finalZoneWithStartYear != NULL && trscount > cnt) {
        const InitialTimeZoneRule *tmpini;
        int32_t tmpcnt = trscount - cnt;
        finalZoneWithStartYear->getTimeZoneRules(tmpini, &trsrules[cnt], tmpcnt, status);
        if (U_FAILURE(status)) {
            return;
        }
        cnt += tmpcnt;
    }
    // Set the result length
    trscount = cnt;
}